

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path_test.cpp
# Opt level: O2

void __thiscall
portability_path_test_portability_path_test_path_get_name_two_dots_Test::
portability_path_test_portability_path_test_path_get_name_two_dots_Test
          (portability_path_test_portability_path_test_path_get_name_two_dots_Test *this)

{
  portability_path_test::portability_path_test(&this->super_portability_path_test);
  (this->super_portability_path_test).super_Test._vptr_Test = (_func_int **)&PTR__Test_00156298;
  return;
}

Assistant:

TEST_F(portability_path_test, portability_path_test_path_get_name_two_dots)
{
	static const char base[] = "/a/b/c/..";
	static const char result[] = "";

	string_name name;

	size_t size = portability_path_get_name(base, sizeof(base), name, NAME_SIZE);

	EXPECT_EQ((int)0, (int)strcmp(name, result));
	EXPECT_EQ((size_t)size, (size_t)sizeof(result));
	EXPECT_EQ((char)'\0', (char)result[size - 1]);
}